

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O1

int psbt_combine(wally_psbt *psbt,wally_psbt *src)

{
  wally_psbt_input *parent;
  wally_psbt_output *output;
  wally_psbt_input *pwVar1;
  wally_psbt_input *pwVar2;
  wally_tx *pwVar3;
  wally_tx_output *src_00;
  wally_tx_witness_stack *p;
  wally_psbt_output *pwVar4;
  wally_psbt_output *pwVar5;
  long lVar6;
  size_t sVar7;
  int iVar8;
  void *pvVar9;
  uchar *puVar10;
  long lVar11;
  uchar **ppuVar12;
  ulong uVar13;
  
  if (psbt->num_inputs == 0) {
    iVar8 = 0;
  }
  else {
    lVar11 = 0;
    uVar13 = 0;
    do {
      pwVar1 = psbt->inputs;
      parent = (wally_psbt_input *)((long)&pwVar1->utxo + lVar11);
      pwVar2 = src->inputs;
      if (pwVar1 == (wally_psbt_input *)0x0) {
        iVar8 = -2;
      }
      else {
        pwVar3 = *(wally_tx **)((long)&pwVar2->utxo + lVar11);
        iVar8 = 0;
        if ((pwVar3 != (wally_tx *)0x0) && (parent->utxo == (wally_tx *)0x0)) {
          iVar8 = wally_tx_clone_alloc(pwVar3,0,(wally_tx **)parent);
        }
      }
      if ((iVar8 == 0) &&
         (((*(long *)((long)&pwVar1->witness_utxo + lVar11) != 0 ||
           (src_00 = *(wally_tx_output **)((long)&pwVar2->witness_utxo + lVar11),
           src_00 == (wally_tx_output *)0x0)) ||
          (iVar8 = wally_tx_output_clone_alloc
                             (src_00,(wally_tx_output **)((long)&pwVar1->witness_utxo + lVar11)),
          iVar8 == 0)))) {
        if ((*(long *)((long)&pwVar1->redeem_script + lVar11) == 0) &&
           (puVar10 = *(uchar **)((long)&pwVar2->redeem_script + lVar11), puVar10 != (uchar *)0x0))
        {
          ppuVar12 = (uchar **)((long)&pwVar1->redeem_script + lVar11);
          sVar7 = *(size_t *)((long)&pwVar2->redeem_script_len + lVar11);
          if (sVar7 == 0) {
            puVar10 = (uchar *)wally_malloc(1);
            *ppuVar12 = puVar10;
            iVar8 = (uint)(puVar10 != (uchar *)0x0) * 3 + -3;
          }
          else if (pwVar1 == (wally_psbt_input *)0x0) {
            iVar8 = -2;
          }
          else {
            iVar8 = replace_bytes(puVar10,sVar7,ppuVar12,
                                  (size_t *)((long)&pwVar1->redeem_script_len + lVar11));
          }
          if (iVar8 != 0) goto LAB_0010883c;
        }
        if ((*(long *)((long)&pwVar1->witness_script + lVar11) == 0) &&
           (puVar10 = *(uchar **)((long)&pwVar2->witness_script + lVar11), puVar10 != (uchar *)0x0))
        {
          ppuVar12 = (uchar **)((long)&pwVar1->witness_script + lVar11);
          sVar7 = *(size_t *)((long)&pwVar2->witness_script_len + lVar11);
          if (sVar7 == 0) {
            puVar10 = (uchar *)wally_malloc(1);
            *ppuVar12 = puVar10;
            iVar8 = (uint)(puVar10 != (uchar *)0x0) * 3 + -3;
          }
          else if (pwVar1 == (wally_psbt_input *)0x0) {
            iVar8 = -2;
          }
          else {
            iVar8 = replace_bytes(puVar10,sVar7,ppuVar12,
                                  (size_t *)((long)&pwVar1->witness_script_len + lVar11));
          }
          if (iVar8 != 0) goto LAB_0010883c;
        }
        if ((*(long *)((long)&pwVar1->final_scriptsig + lVar11) == 0) &&
           (puVar10 = *(uchar **)((long)&pwVar2->final_scriptsig + lVar11), puVar10 != (uchar *)0x0)
           ) {
          ppuVar12 = (uchar **)((long)&pwVar1->final_scriptsig + lVar11);
          sVar7 = *(size_t *)((long)&pwVar2->final_scriptsig_len + lVar11);
          if (sVar7 == 0) {
            puVar10 = (uchar *)wally_malloc(1);
            *ppuVar12 = puVar10;
            iVar8 = (uint)(puVar10 != (uchar *)0x0) * 3 + -3;
          }
          else if (pwVar1 == (wally_psbt_input *)0x0) {
            iVar8 = -2;
          }
          else {
            iVar8 = replace_bytes(puVar10,sVar7,ppuVar12,
                                  (size_t *)((long)&pwVar1->final_scriptsig_len + lVar11));
          }
          if (iVar8 != 0) goto LAB_0010883c;
        }
        if (((((*(long *)((long)&pwVar1->final_witness + lVar11) != 0) ||
              (p = *(wally_tx_witness_stack **)((long)&pwVar2->final_witness + lVar11),
              p == (wally_tx_witness_stack *)0x0)) ||
             (iVar8 = wally_psbt_input_set_final_witness(parent,p), iVar8 == 0)) &&
            ((iVar8 = map_extend((wally_map *)((long)&(pwVar1->keypaths).items + lVar11),
                                 (wally_map *)((long)&(pwVar2->keypaths).items + lVar11),
                                 wally_ec_public_key_verify), iVar8 == 0 &&
             (iVar8 = map_extend((wally_map *)((long)&(pwVar1->signatures).items + lVar11),
                                 (wally_map *)((long)&(pwVar2->signatures).items + lVar11),
                                 wally_ec_public_key_verify), iVar8 == 0)))) &&
           (iVar8 = map_extend((wally_map *)((long)&(pwVar1->unknowns).items + lVar11),
                               (wally_map *)((long)&(pwVar2->unknowns).items + lVar11),
                               (_func_int_uchar_ptr_size_t *)0x0), iVar8 == 0)) {
          if ((*(int *)((long)&pwVar1->sighash + lVar11) == 0) &&
             (iVar8 = *(int *)((long)&pwVar2->sighash + lVar11), iVar8 != 0)) {
            *(int *)((long)&pwVar1->sighash + lVar11) = iVar8;
          }
          if ((*(int *)((long)&pwVar1->has_value + lVar11) == 0) &&
             (*(int *)((long)&pwVar2->has_value + lVar11) != 0)) {
            *(undefined8 *)((long)&pwVar1->value + lVar11) =
                 *(undefined8 *)((long)&pwVar2->value + lVar11);
            *(undefined4 *)((long)&pwVar1->has_value + lVar11) = 1;
          }
          if ((*(long *)((long)&pwVar1->vbf + lVar11) == 0) &&
             (puVar10 = *(uchar **)((long)&pwVar2->vbf + lVar11), puVar10 != (uchar *)0x0)) {
            ppuVar12 = (uchar **)((long)&pwVar1->vbf + lVar11);
            lVar6 = *(long *)((long)&pwVar2->vbf_len + lVar11);
            if (lVar6 == 0) {
              puVar10 = (uchar *)wally_malloc(1);
              *ppuVar12 = puVar10;
              iVar8 = (uint)(puVar10 != (uchar *)0x0) * 3 + -3;
            }
            else {
              iVar8 = -2;
              if ((pwVar1 != (wally_psbt_input *)0x0) && (lVar6 == 0x20)) {
                iVar8 = replace_bytes(puVar10,0x20,ppuVar12,
                                      (size_t *)((long)&pwVar1->vbf_len + lVar11));
              }
            }
            if (iVar8 != 0) goto LAB_0010883c;
          }
          if ((*(long *)((long)&pwVar1->asset + lVar11) == 0) &&
             (puVar10 = *(uchar **)((long)&pwVar2->asset + lVar11), puVar10 != (uchar *)0x0)) {
            ppuVar12 = (uchar **)((long)&pwVar1->asset + lVar11);
            lVar6 = *(long *)((long)&pwVar2->asset_len + lVar11);
            if (lVar6 == 0) {
              puVar10 = (uchar *)wally_malloc(1);
              *ppuVar12 = puVar10;
              iVar8 = (uint)(puVar10 != (uchar *)0x0) * 3 + -3;
            }
            else {
              iVar8 = -2;
              if ((pwVar1 != (wally_psbt_input *)0x0) && (lVar6 == 0x20)) {
                iVar8 = replace_bytes(puVar10,0x20,ppuVar12,
                                      (size_t *)((long)&pwVar1->asset_len + lVar11));
              }
            }
            if (iVar8 != 0) goto LAB_0010883c;
          }
          if ((*(long *)((long)&pwVar1->abf + lVar11) == 0) &&
             (puVar10 = *(uchar **)((long)&pwVar2->abf + lVar11), puVar10 != (uchar *)0x0)) {
            ppuVar12 = (uchar **)((long)&pwVar1->abf + lVar11);
            lVar6 = *(long *)((long)&pwVar2->abf_len + lVar11);
            if (lVar6 == 0) {
              puVar10 = (uchar *)wally_malloc(1);
              *ppuVar12 = puVar10;
              iVar8 = (uint)(puVar10 != (uchar *)0x0) * 3 + -3;
            }
            else {
              iVar8 = -2;
              if ((pwVar1 != (wally_psbt_input *)0x0) && (lVar6 == 0x20)) {
                iVar8 = replace_bytes(puVar10,0x20,ppuVar12,
                                      (size_t *)((long)&pwVar1->abf_len + lVar11));
              }
            }
            if (iVar8 != 0) goto LAB_0010883c;
          }
          pwVar3 = *(wally_tx **)((long)&pwVar2->pegin_tx + lVar11);
          iVar8 = 0;
          if ((pwVar3 != (wally_tx *)0x0) && (*(long *)((long)&pwVar1->pegin_tx + lVar11) == 0)) {
            iVar8 = wally_tx_clone_alloc(pwVar3,0,(wally_tx **)((long)&pwVar1->pegin_tx + lVar11));
          }
          if (iVar8 == 0) {
            if ((*(long *)((long)&pwVar1->txoutproof + lVar11) == 0) &&
               (puVar10 = *(uchar **)((long)&pwVar2->txoutproof + lVar11), puVar10 != (uchar *)0x0))
            {
              ppuVar12 = (uchar **)((long)&pwVar1->txoutproof + lVar11);
              sVar7 = *(size_t *)((long)&pwVar2->txoutproof_len + lVar11);
              if (sVar7 == 0) {
                puVar10 = (uchar *)wally_malloc(1);
                *ppuVar12 = puVar10;
                iVar8 = (uint)(puVar10 != (uchar *)0x0) * 3 + -3;
              }
              else if (pwVar1 == (wally_psbt_input *)0x0) {
                iVar8 = -2;
              }
              else {
                iVar8 = replace_bytes(puVar10,sVar7,ppuVar12,
                                      (size_t *)((long)&pwVar1->txoutproof_len + lVar11));
              }
              if (iVar8 != 0) goto LAB_0010883c;
            }
            if ((*(long *)((long)&pwVar1->genesis_blockhash + lVar11) == 0) &&
               (puVar10 = *(uchar **)((long)&pwVar2->genesis_blockhash + lVar11),
               puVar10 != (uchar *)0x0)) {
              ppuVar12 = (uchar **)((long)&pwVar1->genesis_blockhash + lVar11);
              lVar6 = *(long *)((long)&pwVar2->genesis_blockhash_len + lVar11);
              if (lVar6 == 0) {
                puVar10 = (uchar *)wally_malloc(1);
                *ppuVar12 = puVar10;
                iVar8 = (uint)(puVar10 != (uchar *)0x0) * 3 + -3;
              }
              else {
                iVar8 = -2;
                if ((pwVar1 != (wally_psbt_input *)0x0) && (lVar6 == 0x20)) {
                  iVar8 = replace_bytes(puVar10,0x20,ppuVar12,
                                        (size_t *)((long)&pwVar1->genesis_blockhash_len + lVar11));
                }
              }
              if (iVar8 != 0) goto LAB_0010883c;
            }
            if ((*(long *)((long)&pwVar1->claim_script + lVar11) == 0) &&
               (puVar10 = *(uchar **)((long)&pwVar2->claim_script + lVar11), puVar10 != (uchar *)0x0
               )) {
              ppuVar12 = (uchar **)((long)&pwVar1->claim_script + lVar11);
              sVar7 = *(size_t *)((long)&pwVar2->claim_script_len + lVar11);
              if (sVar7 == 0) {
                puVar10 = (uchar *)wally_malloc(1);
                *ppuVar12 = puVar10;
                iVar8 = (uint)(puVar10 != (uchar *)0x0) * 3 + -3;
              }
              else if (pwVar1 == (wally_psbt_input *)0x0) {
                iVar8 = -2;
              }
              else {
                iVar8 = replace_bytes(puVar10,sVar7,ppuVar12,
                                      (size_t *)((long)&pwVar1->claim_script_len + lVar11));
              }
              if (iVar8 != 0) goto LAB_0010883c;
            }
            iVar8 = 0;
          }
        }
      }
LAB_0010883c:
      if (iVar8 != 0) break;
      uVar13 = uVar13 + 1;
      lVar11 = lVar11 + 0x110;
    } while (uVar13 < psbt->num_inputs);
  }
  if (iVar8 == 0) {
    uVar13 = 0xffffffffffffffff;
    lVar11 = 0;
    do {
      uVar13 = uVar13 + 1;
      if (psbt->num_outputs <= uVar13) {
        iVar8 = map_extend(&psbt->unknowns,&src->unknowns,(_func_int_uchar_ptr_size_t *)0x0);
        return iVar8;
      }
      pwVar4 = psbt->outputs;
      pwVar5 = src->outputs;
      iVar8 = map_extend((wally_map *)((long)&(pwVar4->keypaths).items + lVar11),
                         (wally_map *)((long)&(pwVar5->keypaths).items + lVar11),
                         wally_ec_public_key_verify);
      if ((iVar8 == 0) &&
         (iVar8 = map_extend((wally_map *)((long)&(pwVar4->unknowns).items + lVar11),
                             (wally_map *)((long)&(pwVar5->unknowns).items + lVar11),
                             (_func_int_uchar_ptr_size_t *)0x0), iVar8 == 0)) {
        output = (wally_psbt_output *)((long)&pwVar4->redeem_script + lVar11);
        if ((output->redeem_script == (uchar *)0x0) &&
           (puVar10 = *(uchar **)((long)&pwVar5->redeem_script + lVar11), puVar10 != (uchar *)0x0))
        {
          sVar7 = *(size_t *)((long)&pwVar5->redeem_script_len + lVar11);
          if (sVar7 == 0) {
            puVar10 = (uchar *)wally_malloc(1);
            output->redeem_script = puVar10;
            iVar8 = (uint)(puVar10 != (uchar *)0x0) * 3 + -3;
          }
          else if (pwVar4 == (wally_psbt_output *)0x0) {
            iVar8 = -2;
          }
          else {
            iVar8 = replace_bytes(puVar10,sVar7,(uchar **)output,
                                  (size_t *)((long)&pwVar4->redeem_script_len + lVar11));
          }
          if (iVar8 != 0) goto LAB_00108ca8;
        }
        if ((*(long *)((long)&pwVar4->witness_script + lVar11) == 0) &&
           (puVar10 = *(uchar **)((long)&pwVar5->witness_script + lVar11), puVar10 != (uchar *)0x0))
        {
          ppuVar12 = (uchar **)((long)&pwVar4->witness_script + lVar11);
          sVar7 = *(size_t *)((long)&pwVar5->witness_script_len + lVar11);
          if (sVar7 == 0) {
            puVar10 = (uchar *)wally_malloc(1);
            *ppuVar12 = puVar10;
            iVar8 = (uint)(puVar10 != (uchar *)0x0) * 3 + -3;
          }
          else if (pwVar4 == (wally_psbt_output *)0x0) {
            iVar8 = -2;
          }
          else {
            iVar8 = replace_bytes(puVar10,sVar7,ppuVar12,
                                  (size_t *)((long)&pwVar4->witness_script_len + lVar11));
          }
          if (iVar8 != 0) goto LAB_00108ca8;
        }
        if ((*(long *)((long)&pwVar4->blinding_pubkey + lVar11) == 0) &&
           (puVar10 = *(uchar **)((long)&pwVar5->blinding_pubkey + lVar11), puVar10 != (uchar *)0x0)
           ) {
          sVar7 = *(size_t *)((long)&pwVar5->blinding_pubkey_len + lVar11);
          if (sVar7 == 0) {
            pvVar9 = wally_malloc(1);
            *(void **)((long)&pwVar4->blinding_pubkey + lVar11) = pvVar9;
            iVar8 = (uint)(pvVar9 != (void *)0x0) * 3 + -3;
          }
          else {
            iVar8 = wally_psbt_output_set_blinding_pubkey(output,puVar10,sVar7);
          }
          if (iVar8 != 0) goto LAB_00108ca8;
        }
        if ((*(long *)((long)&pwVar4->value_commitment + lVar11) == 0) &&
           (puVar10 = *(uchar **)((long)&pwVar5->value_commitment + lVar11), puVar10 != (uchar *)0x0
           )) {
          ppuVar12 = (uchar **)((long)&pwVar4->value_commitment + lVar11);
          lVar6 = *(long *)((long)&pwVar5->value_commitment_len + lVar11);
          if (lVar6 == 0) {
            puVar10 = (uchar *)wally_malloc(1);
            *ppuVar12 = puVar10;
            iVar8 = (uint)(puVar10 != (uchar *)0x0) * 3 + -3;
          }
          else {
            iVar8 = -2;
            if ((pwVar4 != (wally_psbt_output *)0x0) && (lVar6 == 0x21)) {
              iVar8 = replace_bytes(puVar10,0x21,ppuVar12,
                                    (size_t *)((long)&pwVar4->value_commitment_len + lVar11));
            }
          }
          if (iVar8 != 0) goto LAB_00108ca8;
        }
        if ((*(long *)((long)&pwVar4->vbf + lVar11) == 0) &&
           (puVar10 = *(uchar **)((long)&pwVar5->vbf + lVar11), puVar10 != (uchar *)0x0)) {
          ppuVar12 = (uchar **)((long)&pwVar4->vbf + lVar11);
          lVar6 = *(long *)((long)&pwVar5->vbf_len + lVar11);
          if (lVar6 == 0) {
            puVar10 = (uchar *)wally_malloc(1);
            *ppuVar12 = puVar10;
            iVar8 = (uint)(puVar10 != (uchar *)0x0) * 3 + -3;
          }
          else {
            iVar8 = -2;
            if ((pwVar4 != (wally_psbt_output *)0x0) && (lVar6 == 0x20)) {
              iVar8 = replace_bytes(puVar10,0x20,ppuVar12,
                                    (size_t *)((long)&pwVar4->vbf_len + lVar11));
            }
          }
          if (iVar8 != 0) goto LAB_00108ca8;
        }
        if ((*(long *)((long)&pwVar4->asset_commitment + lVar11) == 0) &&
           (puVar10 = *(uchar **)((long)&pwVar5->asset_commitment + lVar11), puVar10 != (uchar *)0x0
           )) {
          ppuVar12 = (uchar **)((long)&pwVar4->asset_commitment + lVar11);
          lVar6 = *(long *)((long)&pwVar5->asset_commitment_len + lVar11);
          if (lVar6 == 0) {
            puVar10 = (uchar *)wally_malloc(1);
            *ppuVar12 = puVar10;
            iVar8 = (uint)(puVar10 != (uchar *)0x0) * 3 + -3;
          }
          else {
            iVar8 = -2;
            if ((pwVar4 != (wally_psbt_output *)0x0) && (lVar6 == 0x21)) {
              iVar8 = replace_bytes(puVar10,0x21,ppuVar12,
                                    (size_t *)((long)&pwVar4->asset_commitment_len + lVar11));
            }
          }
          if (iVar8 != 0) goto LAB_00108ca8;
        }
        if ((*(long *)((long)&pwVar4->abf + lVar11) == 0) &&
           (puVar10 = *(uchar **)((long)&pwVar5->abf + lVar11), puVar10 != (uchar *)0x0)) {
          ppuVar12 = (uchar **)((long)&pwVar4->abf + lVar11);
          lVar6 = *(long *)((long)&pwVar5->abf_len + lVar11);
          if (lVar6 == 0) {
            puVar10 = (uchar *)wally_malloc(1);
            *ppuVar12 = puVar10;
            iVar8 = (uint)(puVar10 != (uchar *)0x0) * 3 + -3;
          }
          else {
            iVar8 = -2;
            if ((pwVar4 != (wally_psbt_output *)0x0) && (lVar6 == 0x20)) {
              iVar8 = replace_bytes(puVar10,0x20,ppuVar12,
                                    (size_t *)((long)&pwVar4->abf_len + lVar11));
            }
          }
          if (iVar8 != 0) goto LAB_00108ca8;
        }
        if ((*(long *)((long)&pwVar4->nonce + lVar11) == 0) &&
           (puVar10 = *(uchar **)((long)&pwVar5->nonce + lVar11), puVar10 != (uchar *)0x0)) {
          ppuVar12 = (uchar **)((long)&pwVar4->nonce + lVar11);
          lVar6 = *(long *)((long)&pwVar5->nonce_len + lVar11);
          if (lVar6 == 0) {
            puVar10 = (uchar *)wally_malloc(1);
            *ppuVar12 = puVar10;
            iVar8 = (uint)(puVar10 != (uchar *)0x0) * 3 + -3;
          }
          else {
            iVar8 = -2;
            if ((pwVar4 != (wally_psbt_output *)0x0) && (lVar6 == 0x21)) {
              iVar8 = replace_bytes(puVar10,0x21,ppuVar12,
                                    (size_t *)((long)&pwVar4->nonce_len + lVar11));
            }
          }
          if (iVar8 != 0) goto LAB_00108ca8;
        }
        if ((*(long *)((long)&pwVar4->rangeproof + lVar11) == 0) &&
           (puVar10 = *(uchar **)((long)&pwVar5->rangeproof + lVar11), puVar10 != (uchar *)0x0)) {
          ppuVar12 = (uchar **)((long)&pwVar4->rangeproof + lVar11);
          sVar7 = *(size_t *)((long)&pwVar5->rangeproof_len + lVar11);
          if (sVar7 == 0) {
            puVar10 = (uchar *)wally_malloc(1);
            *ppuVar12 = puVar10;
            iVar8 = (uint)(puVar10 != (uchar *)0x0) * 3 + -3;
          }
          else if (pwVar4 == (wally_psbt_output *)0x0) {
            iVar8 = -2;
          }
          else {
            iVar8 = replace_bytes(puVar10,sVar7,ppuVar12,
                                  (size_t *)((long)&pwVar4->rangeproof_len + lVar11));
          }
          if (iVar8 != 0) goto LAB_00108ca8;
        }
        if ((*(long *)((long)&pwVar4->surjectionproof + lVar11) == 0) &&
           (puVar10 = *(uchar **)((long)&pwVar5->surjectionproof + lVar11), puVar10 != (uchar *)0x0)
           ) {
          ppuVar12 = (uchar **)((long)&pwVar4->surjectionproof + lVar11);
          sVar7 = *(size_t *)((long)&pwVar5->surjectionproof_len + lVar11);
          if (sVar7 == 0) {
            puVar10 = (uchar *)wally_malloc(1);
            *ppuVar12 = puVar10;
            iVar8 = (uint)(puVar10 != (uchar *)0x0) * 3 + -3;
          }
          else if (pwVar4 == (wally_psbt_output *)0x0) {
            iVar8 = -2;
          }
          else {
            iVar8 = replace_bytes(puVar10,sVar7,ppuVar12,
                                  (size_t *)((long)&pwVar4->surjectionproof_len + lVar11));
          }
          if (iVar8 != 0) goto LAB_00108ca8;
        }
        iVar8 = 0;
      }
LAB_00108ca8:
      lVar11 = lVar11 + 0xd0;
    } while (iVar8 == 0);
  }
  return iVar8;
}

Assistant:

static int psbt_combine(struct wally_psbt *psbt, const struct wally_psbt *src)
{
    size_t i;
    int ret = WALLY_OK;

    for (i = 0; ret == WALLY_OK && i < psbt->num_inputs; ++i)
        ret = combine_inputs(&psbt->inputs[i], &src->inputs[i]);

    for (i = 0; ret == WALLY_OK && i < psbt->num_outputs; ++i)
        ret = combine_outputs(&psbt->outputs[i], &src->outputs[i]);

    if (ret == WALLY_OK)
        ret = map_extend(&psbt->unknowns, &src->unknowns, NULL);

    return ret;
}